

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O0

void __thiscall
wallet::InitWalletDirTestingSetup::~InitWalletDirTestingSetup(InitWalletDirTestingSetup *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  BasicTestingSetup *in_stack_00000020;
  unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> *this_00;
  
  this_00 = *(unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
              **)(in_FS_OFFSET + 0x28);
  std::filesystem::current_path
            ((path *)&in_RDI[0x17]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>::
  ~unique_ptr(this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~map(in_RDI);
  fs::path::~path((path *)in_RDI);
  fs::path::~path((path *)in_RDI);
  BasicTestingSetup::~BasicTestingSetup(in_stack_00000020);
  if (*(unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> **)
       (in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

InitWalletDirTestingSetup::~InitWalletDirTestingSetup()
{
    fs::current_path(m_cwd);
}